

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O1

int run_test_fork_threadpool_queue_work_simple(void)

{
  uint uVar1;
  int iVar2;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  uv_loop_t loop;
  undefined1 auStack_3e0 [128];
  code *pcStack_360;
  uv_loop_t uStack_358;
  
  puVar4 = &uStack_358;
  pcStack_360 = (code *)0x14fca8;
  puVar3 = (uv_loop_t *)uv_default_loop();
  pcStack_360 = (code *)0x14fcb0;
  assert_run_work(puVar3);
  pcStack_360 = (code *)0x14fcb5;
  uVar1 = fork();
  if (uVar1 == 0) {
    pcStack_360 = (code *)0x14fcdf;
    uVar1 = getpid();
    pcStack_360 = (code *)0x14fcef;
    printf("Running child in %d\n",(ulong)uVar1);
    pcStack_360 = (code *)0x14fcfa;
    uv_loop_init(&uStack_358);
    pcStack_360 = (code *)0x14fd06;
    puts("Child first watch");
    pcStack_360 = (code *)0x14fd0e;
    assert_run_work(&uStack_358);
    pcStack_360 = (code *)0x14fd16;
    uv_loop_close(&uStack_358);
    pcStack_360 = (code *)0x14fd22;
    puts("Child second watch default loop");
    pcStack_360 = (code *)0x14fd27;
    puVar3 = (uv_loop_t *)uv_default_loop();
    pcStack_360 = (code *)0x14fd2f;
    iVar2 = uv_loop_fork(puVar3);
    if (iVar2 == 0) {
      pcStack_360 = (code *)0x14fd38;
      puVar3 = (uv_loop_t *)uv_default_loop();
      pcStack_360 = (code *)0x14fd40;
      assert_run_work(puVar3);
      pcStack_360 = (code *)0x14fd4c;
      puts("Exiting child ");
      goto LAB_0014fd4c;
    }
  }
  else {
    puVar4 = (uv_loop_t *)(ulong)uVar1;
    if (uVar1 != 0xffffffff) {
      pcStack_360 = (code *)0x14fcc9;
      puVar3 = (uv_loop_t *)uv_default_loop();
      pcStack_360 = (code *)0x14fcd1;
      assert_run_work(puVar3);
      pcStack_360 = (code *)0x14fcd8;
      assert_wait_child(uVar1);
LAB_0014fd4c:
      pcStack_360 = (code *)0x14fd51;
      puVar4 = (uv_loop_t *)uv_default_loop();
      pcStack_360 = (code *)0x14fd65;
      uv_walk(puVar4,close_walk_cb,0);
      pcStack_360 = (code *)0x14fd6f;
      uv_run(puVar4,0);
      pcStack_360 = (code *)0x14fd74;
      puVar3 = (uv_loop_t *)uv_default_loop();
      pcStack_360 = (code *)0x14fd7c;
      iVar2 = uv_loop_close(puVar3);
      if (iVar2 == 0) {
        return 0;
      }
      pcStack_360 = (code *)0x14fd90;
      run_test_fork_threadpool_queue_work_simple_cold_3();
    }
    pcStack_360 = (code *)0x14fd95;
    run_test_fork_threadpool_queue_work_simple_cold_2();
  }
  pcStack_360 = assert_run_work;
  run_test_fork_threadpool_queue_work_simple_cold_1();
  pcStack_360 = (code *)puVar4;
  if (work_cb_count == 0) {
    if (after_work_cb_count != 0) goto LAB_0014fe3e;
    uVar1 = getpid();
    printf("Queue in %d\n",(ulong)uVar1);
    iVar2 = uv_queue_work(puVar3,auStack_3e0,work_cb,after_work_cb);
    if (iVar2 != 0) goto LAB_0014fe43;
    uVar1 = getpid();
    printf("Running in %d\n",(ulong)uVar1);
    uv_run(puVar3,0);
    if (work_cb_count == 1) {
      if (after_work_cb_count == 1) {
        work_cb_count = 0;
        after_work_cb_count = 0;
        return 0;
      }
      goto LAB_0014fe4d;
    }
  }
  else {
    assert_run_work_cold_1();
LAB_0014fe3e:
    assert_run_work_cold_2();
LAB_0014fe43:
    assert_run_work_cold_3();
  }
  assert_run_work_cold_4();
LAB_0014fe4d:
  assert_run_work_cold_5();
  timer_cb_called = timer_cb_called + 1;
  iVar2 = uv_close();
  return iVar2;
}

Assistant:

TEST_IMPL(fork_threadpool_queue_work_simple) {
  /* The threadpool works in a child process. */

  pid_t child_pid;
  uv_loop_t loop;

  /* Prime the pool and default loop. */
  assert_run_work(uv_default_loop());

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* Parent. We can still run work. */
    assert_run_work(uv_default_loop());
    assert_wait_child(child_pid);
  } else {
    /* Child. We can work in a new loop. */
    printf("Running child in %d\n", getpid());
    uv_loop_init(&loop);
    printf("Child first watch\n");
    assert_run_work(&loop);
    uv_loop_close(&loop);
    printf("Child second watch default loop\n");
    /* We can work in the default loop. */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    assert_run_work(uv_default_loop());
    printf("Exiting child \n");
  }


  MAKE_VALGRIND_HAPPY();
  return 0;
}